

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O3

psa_status_t psa_its_get_info(psa_storage_uid_t uid,psa_storage_info_t *p_info)

{
  psa_status_t pVar1;
  FILE *stream;
  FILE *local_18;
  
  local_18 = (FILE *)0x0;
  pVar1 = psa_its_read_file(uid,p_info,(FILE **)&local_18);
  if (local_18 != (FILE *)0x0) {
    fclose(local_18);
  }
  return pVar1;
}

Assistant:

psa_status_t psa_its_get_info( psa_storage_uid_t uid,
                               struct psa_storage_info_t *p_info )
{
    psa_status_t status;
    FILE *stream = NULL;
    status = psa_its_read_file( uid, p_info, &stream );
    if( stream != NULL )
        fclose( stream );
    return( status );
}